

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  Vector *pVVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  string_t sVar16;
  UnifiedVectorFormat state_format;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  ulong local_a8;
  Vector *local_a0;
  long local_98;
  long local_90;
  idx_t local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_88 = offset;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar7 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    iVar10 = 0;
    do {
      iVar11 = iVar10;
      if (*local_78 != 0) {
        iVar11 = (idx_t)*(uint *)(*local_78 + iVar10 * 4);
      }
      lVar14 = lVar14 + *(long *)(*(long *)(local_70 + iVar11 * 8) + 0x10);
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  duckdb::ListVector::Reserve(result,lVar14 + uVar7);
  local_98 = *(long *)(result + 0x20);
  pVVar8 = (Vector *)duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    local_90 = local_70;
    local_a0 = result + 0x30;
    uVar12 = 0;
    local_a8 = count;
    do {
      uVar15 = uVar12;
      if (*local_78 != 0) {
        uVar15 = (ulong)*(uint *)(*local_78 + uVar12 * 4);
      }
      uVar1 = uVar12 + local_88;
      lVar14 = *(long *)(local_90 + uVar15 * 8);
      if ((*(char *)(lVar14 + 0x18) == '\x01') && (lVar3 = *(long *)(lVar14 + 0x10), lVar3 != 0)) {
        *(ulong *)(local_98 + uVar1 * 0x10) = uVar7;
        *(long *)(local_98 + 8 + uVar1 * 0x10) = lVar3;
        local_b8._M_comp = BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::GreaterThan>::Compare
        ;
        std::
        __sort_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                  (*(pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar14 + 8),
                   *(pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar14 + 8) + lVar3,&local_b8);
        if (*(long *)(lVar14 + 0x10) != 0) {
          puVar13 = (undefined8 *)(*(long *)(lVar14 + 8) + 0x10);
          uVar15 = 0;
          do {
            sVar16.value.pointer.ptr = (char *)*puVar13;
            sVar16.value._0_8_ = puVar13[-1];
            duckdb::CreateSortKeyHelpers::DecodeSortKey
                      (sVar16,pVVar8,uVar7 + uVar15,(OrderModifiers)0x302);
            uVar15 = uVar15 + 1;
            puVar13 = puVar13 + 5;
          } while (uVar15 < *(ulong *)(lVar14 + 0x10));
          uVar7 = uVar7 + uVar15;
          count = local_a8;
        }
      }
      else {
        if (*(long *)(result + 0x28) == 0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var6 = p_Stack_b0;
          _Var5._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
                *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(_func_bool_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
            **)(result + 0x30) = _Var5._M_comp;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_a0);
          *(unsigned_long **)(result + 0x28) =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar4 = (byte)uVar1 & 0x3f;
        puVar2 = (ulong *)(*(long *)(result + 0x28) + (uVar1 >> 6) * 8);
        *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar7);
  duckdb::Vector::Verify((ulong)result);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}